

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isorr_ce.c
# Opt level: O1

void test_read_format_isorr_ce(void)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar4;
  archive *a;
  char *pcVar5;
  long v2;
  int64_t iVar6;
  time_t tVar7;
  stat *psVar8;
  longlong v2_00;
  archive_entry *ae;
  int64_t offset;
  void *p;
  size_t size;
  char path2 [160];
  char path3 [160];
  char path1 [160];
  archive_entry *local_240;
  int local_234;
  longlong local_230;
  void *local_228;
  int local_220 [2];
  char local_218 [152];
  undefined1 local_180;
  char local_178 [153];
  undefined1 local_df;
  char local_d8 [151];
  undefined1 local_41;
  
  memset(local_d8,0x61,0x97);
  local_41 = 0;
  memset(local_218,0x61,0x98);
  local_180 = 0;
  memset(local_178,0x61,0x99);
  local_df = 0;
  extract_reference_file("test_read_format_iso_rockridge_ce.iso.Z");
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                   ,L'f',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                      ,L'g',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                      ,L'h',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename(a,"test_read_format_iso_rockridge_ce.iso.Z",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                      ,L'j',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar1 = 8;
  do {
    iVar3 = archive_read_next_header(a,&local_240);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                        ,L'o',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(local_240);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                        ,L'q',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar3 = archive_read_has_encrypted_entries(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                        ,L'r',(long)iVar3,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
    pcVar5 = archive_entry_pathname(local_240);
    iVar3 = strcmp(".",pcVar5);
    if (iVar3 == 0) {
      mVar4 = archive_entry_filetype(local_240);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'v',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      iVar6 = archive_entry_size(local_240);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'w',0x800,"2048",iVar6,"archive_entry_size(ae)",(void *)0x0);
      tVar7 = archive_entry_mtime(local_240);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'y',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
      v2 = archive_entry_mtime_nsec(local_240);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'z',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
      psVar8 = archive_entry_stat((archive_entry_conflict *)local_240);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'|',3,"3",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                          (void *)0x0);
      iVar6 = archive_entry_uid(local_240);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'}',1,"1",iVar6,"archive_entry_uid(ae)",(void *)0x0);
      iVar3 = archive_read_data_block(a,&local_228,(size_t *)local_220,&local_230);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'\x7f',1,"ARCHIVE_EOF",(long)iVar3,
                          "archive_read_data_block(a, &p, &size, &offset)",a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'\x80',(long)local_220[0],"(int)size",0,"0",(void *)0x0);
    }
    else {
      local_234 = iVar1;
      pcVar5 = archive_entry_pathname(local_240);
      iVar1 = strcmp("dir",pcVar5);
      pcVar5 = archive_entry_pathname(local_240);
      if (iVar1 == 0) {
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                   ,L'\x83',"dir","\"dir\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar4 = archive_entry_filetype(local_240);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                            ,L'\x84',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                            (void *)0x0);
        iVar6 = archive_entry_size(local_240);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                            ,L'\x85',0x800,"2048",iVar6,"archive_entry_size(ae)",(void *)0x0);
        tVar7 = archive_entry_mtime(local_240);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                            ,L'\x86',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
        tVar7 = archive_entry_atime(local_240);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                            ,L'\x87',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
        psVar8 = archive_entry_stat((archive_entry_conflict *)local_240);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                            ,L'\x88',2,"2",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                            (void *)0x0);
        iVar6 = archive_entry_uid(local_240);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                            ,L'\x89',1,"1",iVar6,"archive_entry_uid(ae)",(void *)0x0);
        iVar6 = archive_entry_gid(local_240);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                            ,L'\x8a',2,"2",iVar6,"archive_entry_gid(ae)",(void *)0x0);
        iVar1 = local_234;
      }
      else {
        iVar1 = strcmp(local_d8,pcVar5);
        pcVar5 = archive_entry_pathname(local_240);
        if (iVar1 == 0) {
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                     ,L'\x8d',local_d8,"path1",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0'
                    );
          mVar4 = archive_entry_filetype(local_240);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x8e',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                              (void *)0x0);
          iVar6 = archive_entry_size(local_240);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x8f',0xffa,"4090",iVar6,"archive_entry_size(ae)",(void *)0x0);
          iVar1 = archive_read_data_block(a,&local_228,(size_t *)local_220,&local_230);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x91',0,"0",(long)iVar1,
                              "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x92',0,"0",local_230,"offset",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x93',local_228,"p","hello 151\n","\"hello 151\\n\"",10,"10",
                              (void *)0x0);
          tVar7 = archive_entry_mtime(local_240);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x94',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
          tVar7 = archive_entry_atime(local_240);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x95',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
          psVar8 = archive_entry_stat((archive_entry_conflict *)local_240);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x96',1,"1",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                              (void *)0x0);
          iVar6 = archive_entry_uid(local_240);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x97',1,"1",iVar6,"archive_entry_uid(ae)",(void *)0x0);
          iVar6 = archive_entry_gid(local_240);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,L'\x98',2,"2",iVar6,"archive_entry_gid(ae)",(void *)0x0);
          iVar1 = local_234;
        }
        else {
          iVar3 = strcmp(local_218,pcVar5);
          pcVar5 = archive_entry_pathname(local_240);
          iVar1 = local_234;
          if (iVar3 == 0) {
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                       ,L'\x9b',local_218,"path2",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
            mVar4 = archive_entry_filetype(local_240);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'\x9c',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)"
                                ,(void *)0x0);
            iVar6 = archive_entry_size(local_240);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'\x9d',0xffa,"4090",iVar6,"archive_entry_size(ae)",(void *)0x0);
            iVar3 = archive_read_data_block(a,&local_228,(size_t *)local_220,&local_230);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'\x9f',0,"0",(long)iVar3,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'\xa0',0,"0",local_230,"offset",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'¡',local_228,"p","hello 152\n","\"hello 152\\n\"",10,"10",
                                (void *)0x0);
            tVar7 = archive_entry_mtime(local_240);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'¢',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
            tVar7 = archive_entry_atime(local_240);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'£',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
            psVar8 = archive_entry_stat((archive_entry_conflict *)local_240);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'¤',1,"1",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                                (void *)0x0);
            iVar6 = archive_entry_uid(local_240);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                ,L'¥',1,"1",iVar6,"archive_entry_uid(ae)",(void *)0x0);
            v2_00 = archive_entry_gid(local_240);
            wVar2 = L'¦';
          }
          else {
            iVar3 = strcmp(local_178,pcVar5);
            pcVar5 = archive_entry_pathname(local_240);
            if (iVar3 == 0) {
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                         ,L'©',local_178,"path3",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                         L'\0');
              mVar4 = archive_entry_filetype(local_240);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'ª',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)"
                                  ,(void *)0x0);
              iVar6 = archive_entry_size(local_240);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'«',0xffa,"4090",iVar6,"archive_entry_size(ae)",(void *)0x0);
              iVar3 = archive_read_data_block(a,&local_228,(size_t *)local_220,&local_230);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'­',0,"0",(long)iVar3,
                                  "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'®',0,"0",local_230,"offset",(void *)0x0);
              assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'¯',local_228,"p","hello 153\n","\"hello 153\\n\"",10,"10",
                                  (void *)0x0);
              tVar7 = archive_entry_mtime(local_240);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'°',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0
                                 );
              tVar7 = archive_entry_atime(local_240);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'±',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0
                                 );
              psVar8 = archive_entry_stat((archive_entry_conflict *)local_240);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'²',1,"1",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",
                                  (void *)0x0);
              iVar6 = archive_entry_uid(local_240);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                  ,L'³',1,"1",iVar6,"archive_entry_uid(ae)",(void *)0x0);
              v2_00 = archive_entry_gid(local_240);
              wVar2 = L'´';
            }
            else {
              iVar3 = strcmp("sym1",pcVar5);
              if (iVar3 == 0) {
                mVar4 = archive_entry_filetype(local_240);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                    ,L'·',0xa000,"AE_IFLNK",(ulong)mVar4,
                                    "archive_entry_filetype(ae)",(void *)0x0);
                pcVar5 = archive_entry_symlink(local_240);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                           ,L'¸',local_d8,"path1",pcVar5,"archive_entry_symlink(ae)",(void *)0x0,
                           L'\0');
                iVar6 = archive_entry_size(local_240);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                    ,L'¹',0,"0",iVar6,"archive_entry_size(ae)",(void *)0x0);
                tVar7 = archive_entry_mtime(local_240);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                    ,L'º',0x2a302,"172802",tVar7,"archive_entry_mtime(ae)",
                                    (void *)0x0);
                psVar8 = archive_entry_stat((archive_entry_conflict *)local_240);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                    ,L'»',1,"1",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink"
                                    ,(void *)0x0);
                iVar6 = archive_entry_uid(local_240);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                    ,L'¼',1,"1",iVar6,"archive_entry_uid(ae)",(void *)0x0);
                v2_00 = archive_entry_gid(local_240);
                wVar2 = L'½';
              }
              else {
                pcVar5 = archive_entry_pathname(local_240);
                iVar3 = strcmp("sym2",pcVar5);
                if (iVar3 == 0) {
                  mVar4 = archive_entry_filetype(local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'À',0xa000,"AE_IFLNK",(ulong)mVar4,
                                      "archive_entry_filetype(ae)",(void *)0x0);
                  pcVar5 = archive_entry_symlink(local_240);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                             ,L'Á',local_218,"path2",pcVar5,"archive_entry_symlink(ae)",(void *)0x0
                             ,L'\0');
                  iVar6 = archive_entry_size(local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'Â',0,"0",iVar6,"archive_entry_size(ae)",(void *)0x0);
                  tVar7 = archive_entry_mtime(local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'Ã',0x2a302,"172802",tVar7,"archive_entry_mtime(ae)",
                                      (void *)0x0);
                  psVar8 = archive_entry_stat((archive_entry_conflict *)local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'Ä',1,"1",psVar8->st_nlink,
                                      "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                  iVar6 = archive_entry_uid(local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'Å',1,"1",iVar6,"archive_entry_uid(ae)",(void *)0x0);
                  v2_00 = archive_entry_gid(local_240);
                  wVar2 = L'Æ';
                }
                else {
                  pcVar5 = archive_entry_pathname(local_240);
                  iVar3 = strcmp("sym3",pcVar5);
                  if (iVar3 != 0) {
                    failure("Saw a file that shouldn\'t have been there");
                    pcVar5 = archive_entry_pathname(local_240);
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                               ,L'Ò',pcVar5,"archive_entry_pathname(ae)","","\"\"",(void *)0x0,
                               L'\0');
                    goto LAB_0016bdf0;
                  }
                  mVar4 = archive_entry_filetype(local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'É',0xa000,"AE_IFLNK",(ulong)mVar4,
                                      "archive_entry_filetype(ae)",(void *)0x0);
                  pcVar5 = archive_entry_symlink(local_240);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                             ,L'Ê',local_178,"path3",pcVar5,"archive_entry_symlink(ae)",(void *)0x0
                             ,L'\0');
                  iVar6 = archive_entry_size(local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'Ë',0,"0",iVar6,"archive_entry_size(ae)",(void *)0x0);
                  tVar7 = archive_entry_mtime(local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'Ì',0x2a302,"172802",tVar7,"archive_entry_mtime(ae)",
                                      (void *)0x0);
                  psVar8 = archive_entry_stat((archive_entry_conflict *)local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'Í',1,"1",psVar8->st_nlink,
                                      "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                  iVar6 = archive_entry_uid(local_240);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                                      ,L'Î',1,"1",iVar6,"archive_entry_uid(ae)",(void *)0x0);
                  v2_00 = archive_entry_gid(local_240);
                  wVar2 = L'Ï';
                }
              }
            }
          }
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                              ,wVar2,2,"2",v2_00,"archive_entry_gid(ae)",(void *)0x0);
        }
      }
    }
LAB_0016bdf0:
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar1 = archive_read_next_header(a,&local_240);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'×',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          (void *)0x0);
      iVar1 = archive_filter_code(a,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'Ú',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS"
                          ,(void *)0x0);
      iVar1 = archive_format(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'Û',(long)iVar1,"archive_format(a)",0x40001,
                          "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
      iVar1 = archive_read_close(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'Þ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
      iVar1 = archive_read_free(a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isorr_ce.c"
                          ,L'ß',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_read_format_isorr_ce)
{
	const char *refname = "test_read_format_iso_rockridge_ce.iso.Z";
	char path1[160];
	char path2[160];
	char path3[160];
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	mkpath(path1, 151);
	mkpath(path2, 152);
	mkpath(path3, 153);
	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 8 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 8; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));
		
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("dir", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp(path1, archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString(path1, archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(4090, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello 151\n", 10);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp(path2, archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString(path2, archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(4090, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello 152\n", 10);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp(path3, archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString(path3, archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(4090, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello 153\n", 10);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("sym1", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(path1, archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("sym2", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(path2, archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("sym3", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(path3, archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}